

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O1

void __thiscall
re::beatnik::viterbi<float,_256L>::calculate_transition
          (viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  array<float,_256UL> *paVar4;
  array<long,_256UL> *paVar5;
  int i;
  ulong permutation;
  pair<long,_float> pVar6;
  array<float,_128UL> temp;
  float afStack_230 [128];
  
  paVar4 = &this->delta;
  paVar5 = &this->psi;
  permutation = 0;
  lVar3 = 0;
  do {
    uVar2 = (uint)permutation & 0x7f;
    if (0x7f < permutation) {
      lVar1 = lVar3 * 4;
      lVar3 = lVar3 + 1;
      paVar4->_M_elems[0] = *(float *)((long)input.storage_.data_ + lVar1) * afStack_230[uVar2];
      paVar4 = (array<float,_256UL> *)(paVar4->_M_elems + 1);
    }
    if (permutation < 0x100) {
      pVar6 = max_delta_element(this,permutation);
      paVar5->_M_elems[0] = pVar6.first;
      paVar5 = (array<long,_256UL> *)(paVar5->_M_elems + 1);
      afStack_230[uVar2] = pVar6.second;
    }
    permutation = permutation + 1;
  } while (permutation != 0x180);
  return;
}

Assistant:

void
    calculate_transition(gsl::span<T const, N> input) noexcept
    {
        auto delta_it = std::begin(delta);
        auto psi_it = std::begin(psi);
        auto input_it = std::cbegin(input);

        std::array<T, radius> temp;

        for (auto i = 0; i < 3 * radius; i++) {
            auto m = i % radius;
            if (i >= radius) {
                *(delta_it++) = *(input_it++) * temp[m];
            }
            if (i < N) {
                auto max_el = max_delta_element(i);
                *(psi_it++) = max_el.first; // index
                temp[m] = max_el.second; // value
            }
        }
    }